

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O2

string * __thiscall TrodesMsg::getformat_abi_cxx11_(string *__return_storage_ptr__,TrodesMsg *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string TrodesMsg::getformat() const
{
    return format;
}